

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

bool __thiscall CCoinsViewCache::HaveInputs(CCoinsViewCache *this,CTransaction *tx)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = CTransaction::IsCoinBase(tx);
  if (!bVar3) {
    bVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (bVar3) {
      iVar4 = (*(this->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])(this);
      if ((char)iVar4 != '\0') {
        uVar6 = 1;
        do {
          pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) * 0x4ec4ec4ec4ec4ec5
          ;
          bVar7 = uVar5 - uVar6 == 0;
          bVar3 = uVar5 >= uVar6 && !bVar7;
          if (uVar5 < uVar6 || bVar7) goto LAB_0069627f;
          iVar4 = (*(this->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                            (this,pCVar2 + uVar6);
          uVar6 = (ulong)((int)uVar6 + 1);
        } while ((char)iVar4 != '\0');
      }
      if (bVar3) {
        bVar3 = false;
        goto LAB_00696281;
      }
    }
  }
LAB_0069627f:
  bVar3 = true;
LAB_00696281:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::HaveInputs(const CTransaction& tx) const
{
    if (!tx.IsCoinBase()) {
        for (unsigned int i = 0; i < tx.vin.size(); i++) {
            if (!HaveCoin(tx.vin[i].prevout)) {
                return false;
            }
        }
    }
    return true;
}